

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeConstraints::applyConstraints(FluctuatingChargeConstraints *this)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  pointer ppAVar9;
  Molecule *pMVar10;
  pointer ppAVar11;
  long lVar12;
  Atom *pAVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  pointer ppAVar17;
  Atom *pAVar18;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  MoleculeIterator i;
  MoleculeIterator local_30;
  double local_28;
  
  if (this->initialized_ == false) {
    if ((this->info_->usesFluctuatingCharges_ == true) &&
       (0 < this->info_->nGlobalFluctuatingCharges_)) {
      this->hasFlucQ_ = true;
    }
    this->initialized_ = true;
  }
  if (this->hasFlucQ_ == true) {
    local_30._M_node = (_Base_ptr)0x0;
    if (this->constrainRegions_ == true) {
      pdVar5 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar5 != pdVar6) {
        memset(pdVar5,0,((long)pdVar6 + (-8 - (long)pdVar5) & 0xfffffffffffffff8U) + 8);
      }
      piVar7 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar7 != piVar8) {
        memset(piVar7,0,((long)piVar8 + (-4 - (long)piVar7) & 0xfffffffffffffffcU) + 4);
      }
    }
    pMVar10 = SimInfo::beginMolecule(this->info_,&local_30);
    if (pMVar10 == (Molecule *)0x0) {
      local_28 = NAN;
    }
    else {
      iVar19 = 0;
      local_28 = 0.0;
      do {
        if (pMVar10->constrainTotalCharge_ == false) {
          ppAVar11 = (pMVar10->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar9 = (pMVar10->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar11 == ppAVar9) {
            pAVar13 = (Atom *)0x0;
          }
          else {
            pAVar13 = *ppAVar11;
          }
          if (pAVar13 != (Atom *)0x0) {
            uVar3 = pMVar10->molStamp_->region_;
            bVar2 = this->constrainRegions_;
            piVar7 = (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar8 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              ppAVar11 = ppAVar11 + 1;
              dVar20 = *(double *)
                        (*(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  (pAVar13->super_StuntDouble).storage_) +
                        (long)(pAVar13->super_StuntDouble).localIndex_ * 8);
              if ((-1 < (int)uVar3 & bVar2) == 0) {
                local_28 = local_28 + dVar20;
                iVar19 = iVar19 + 1;
              }
              else {
                iVar4 = piVar7[uVar3];
                pdVar5[iVar4] = dVar20 + pdVar5[iVar4];
                piVar1 = piVar8 + iVar4;
                *piVar1 = *piVar1 + 1;
              }
              if (ppAVar11 == ppAVar9) {
                pAVar13 = (Atom *)0x0;
              }
              else {
                pAVar13 = *ppAVar11;
              }
            } while (pAVar13 != (Atom *)0x0);
          }
        }
        pMVar10 = SimInfo::nextMolecule(this->info_,&local_30);
      } while (pMVar10 != (Molecule *)0x0);
      local_28 = local_28 / (double)iVar19;
    }
    if (this->constrainRegions_ == true) {
      pdVar5 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = (long)(this->regionForce_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5;
      if (lVar12 != 0) {
        piVar7 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          pdVar5[uVar16] = pdVar5[uVar16] / (double)piVar7[uVar16];
          uVar16 = uVar16 + 1;
        } while ((uVar16 & 0xffffffff) < (ulong)(lVar12 >> 3));
      }
    }
    pMVar10 = SimInfo::beginMolecule(this->info_,&local_30);
    if (pMVar10 != (Molecule *)0x0) {
      do {
        if (pMVar10->constrainTotalCharge_ == true) {
          ppAVar11 = (pMVar10->fluctuatingCharges_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar9 = (pMVar10->fluctuatingCharges_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppAVar11 == ppAVar9) {
            pAVar13 = (Atom *)0x0;
          }
          else {
            pAVar13 = *ppAVar11;
          }
          if (pAVar13 == (Atom *)0x0) {
            dVar20 = 0.0;
          }
          else {
            dVar20 = 0.0;
            ppAVar17 = ppAVar11;
            do {
              ppAVar17 = ppAVar17 + 1;
              if (ppAVar17 == ppAVar9) {
                pAVar18 = (Atom *)0x0;
              }
              else {
                pAVar18 = *ppAVar17;
              }
              dVar20 = dVar20 + *(double *)
                                 (*(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                                    currentSnapshot_->atomData).flucQFrc.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           (pAVar13->super_StuntDouble).storage_) +
                                 (long)(pAVar13->super_StuntDouble).localIndex_ * 8);
              pAVar13 = pAVar18;
            } while (pAVar18 != (Atom *)0x0);
          }
          lVar12 = (long)ppAVar9 - (long)ppAVar11 >> 3;
          auVar21._8_4_ = (int)((long)ppAVar9 - (long)ppAVar11 >> 0x23);
          auVar21._0_8_ = lVar12;
          auVar21._12_4_ = 0x45300000;
          if (ppAVar9 == ppAVar11) {
            pAVar13 = (Atom *)0x0;
          }
          else {
            pAVar13 = *ppAVar11;
          }
          if (pAVar13 != (Atom *)0x0) {
            do {
              ppAVar11 = ppAVar11 + 1;
              lVar14 = (long)(pAVar13->super_StuntDouble).localIndex_;
              lVar15 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQFrc.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar13->super_StuntDouble).storage_);
              *(double *)(lVar15 + lVar14 * 8) =
                   *(double *)(lVar15 + lVar14 * 8) -
                   dVar20 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
              if (ppAVar11 == ppAVar9) {
                pAVar13 = (Atom *)0x0;
              }
              else {
                pAVar13 = *ppAVar11;
              }
            } while (pAVar13 != (Atom *)0x0);
          }
        }
        else {
          lVar12 = (long)pMVar10->molStamp_->region_;
          if ((lVar12 < 0) || (this->constrainRegions_ == false)) {
            ppAVar11 = (pMVar10->fluctuatingCharges_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppAVar9 = (pMVar10->fluctuatingCharges_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppAVar11 == ppAVar9) {
              pAVar13 = (Atom *)0x0;
            }
            else {
              pAVar13 = *ppAVar11;
            }
            while (pAVar13 != (Atom *)0x0) {
              ppAVar11 = ppAVar11 + 1;
              lVar15 = (long)(pAVar13->super_StuntDouble).localIndex_;
              lVar12 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQFrc.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar13->super_StuntDouble).storage_);
              *(double *)(lVar12 + lVar15 * 8) = *(double *)(lVar12 + lVar15 * 8) - local_28;
              if (ppAVar11 == ppAVar9) {
                pAVar13 = (Atom *)0x0;
              }
              else {
                pAVar13 = *ppAVar11;
              }
            }
          }
          else {
            ppAVar11 = (pMVar10->fluctuatingCharges_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppAVar9 = (pMVar10->fluctuatingCharges_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppAVar11 == ppAVar9) {
              pAVar13 = (Atom *)0x0;
            }
            else {
              pAVar13 = *ppAVar11;
            }
            if (pAVar13 != (Atom *)0x0) {
              dVar20 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12]];
              do {
                ppAVar11 = ppAVar11 + 1;
                lVar15 = (long)(pAVar13->super_StuntDouble).localIndex_;
                lVar12 = *(long *)((long)&(((pAVar13->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                  (pAVar13->super_StuntDouble).storage_);
                *(double *)(lVar12 + lVar15 * 8) = *(double *)(lVar12 + lVar15 * 8) - dVar20;
                if (ppAVar11 == ppAVar9) {
                  pAVar13 = (Atom *)0x0;
                }
                else {
                  pAVar13 = *ppAVar11;
                }
              } while (pAVar13 != (Atom *)0x0);
            }
          }
        }
        pMVar10 = SimInfo::nextMolecule(this->info_,&local_30);
      } while (pMVar10 != (Molecule *)0x0);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::applyConstraints() {
    if (!initialized_) initialize();
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    RealType frc, systemFrc, molFrc, regionFrc;
    int systemCharges;

    // accumulate the system fluctuating charge forces, but we have
    // separate constraints for any charges in defined regions and for
    // molecules with constrained charges:

    systemFrc     = 0.0;
    systemCharges = 0;
    if (constrainRegions_) {
      std::fill(regionForce_.begin(), regionForce_.end(), 0.0);
      std::fill(regionCharges_.begin(), regionCharges_.end(), 0);
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (!mol->constrainTotalCharge()) {
        int region = mol->getRegion();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          frc = atom->getFlucQFrc();
          if (constrainRegions_ && region >= 0) {
            regionForce_[regionKeys_[region]] += frc;
            regionCharges_[regionKeys_[region]] += 1;
          } else {
            systemFrc += frc;
            systemCharges += 1;
          }
        }
      }
    }

#ifdef IS_MPI
    // in parallel, we need to add up the contributions from all
    // processors:
    MPI_Allreduce(MPI_IN_PLACE, &systemFrc, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &systemCharges, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    if (constrainRegions_) {
      MPI_Allreduce(MPI_IN_PLACE, &regionForce_[0], regionForce_.size(),
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &regionCharges_[0], regionCharges_.size(),
                    MPI_INT, MPI_SUM, MPI_COMM_WORLD);
    }

#endif

    // divide by the total number of fluctuating charges:
    systemFrc /= systemCharges;

    // do the same in the regions:
    if (constrainRegions_) {
      for (unsigned int i = 0; i < regionForce_.size(); ++i) {
        regionForce_[i] /= regionCharges_[i];
      }
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      molFrc = 0.0;

      if (mol->constrainTotalCharge()) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          molFrc += atom->getFlucQFrc();
        }
        molFrc /= mol->getNFluctuatingCharges();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          frc = atom->getFlucQFrc() - molFrc;
          atom->setFlucQFrc(frc);
        }
      } else {
        int region = mol->getRegion();

        regionFrc = 0.0;
        if (constrainRegions_ && region >= 0) {
          regionFrc = regionForce_[regionKeys_[region]];

          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            frc = atom->getFlucQFrc() - regionFrc;
            atom->setFlucQFrc(frc);
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            frc = atom->getFlucQFrc() - systemFrc;
            atom->setFlucQFrc(frc);
          }
        }
      }
    }
  }